

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

var __thiscall
cs_impl::runtime_cs_ext::wait_for_impl
          (runtime_cs_ext *this,size_t mill_sec,callable *func,vector *args)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  future_status fVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<cs_impl::any> *p_Var5;
  long *plVar6;
  _State_baseV2 *__tmp;
  bool bVar7;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  future<cs_impl::any> future;
  __state_type local_98;
  long *local_80;
  uint *local_78;
  long local_70;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  __basic_future<cs_impl::any> local_58;
  element_type *local_48;
  _func_int **local_40 [2];
  
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = (element_type *)mill_sec;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002589a0;
  peVar1 = (element_type *)(p_Var4 + 1);
  p_Var4[2]._M_use_count = 0;
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
  p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[3]._M_use_count = 0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_002589f0;
  p_Var5 = (_Result<cs_impl::any> *)operator_new(0x20);
  std::__future_base::_Result<cs_impl::any>::_Result(p_Var5);
  p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
  *(callable **)&p_Var4[4]._M_use_count = func;
  p_Var4[5]._vptr__Sp_counted_base = (_func_int **)args;
  local_40[0] = (_func_int **)0x0;
  local_80 = (long *)operator_new(0x20);
  *local_80 = (long)&PTR___State_00258a48;
  local_80[1] = (long)peVar1;
  local_80[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1379:65)>_>,_cs_impl::any>
                      ::_M_run;
  local_80[3] = 0;
  std::thread::_M_start_thread(local_40,&local_80,0);
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  _Var2._M_pi = local_98.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (p_Var4[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var4[3]._vptr__Sp_counted_base = local_40[0];
    bVar7 = local_98.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (bVar7) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if (local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00258a88;
      p_Var4[2]._M_use_count = 0;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00258ad8;
      p_Var5 = (_Result<cs_impl::any> *)operator_new(0x20);
      std::__future_base::_Result<cs_impl::any>::_Result(p_Var5);
      _Var2._M_pi = local_98.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
      *(callable **)&p_Var4[3]._M_use_count = func;
      p_Var4[4]._vptr__Sp_counted_base = (_func_int **)args;
      bVar7 = local_98.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var4 + 1);
      local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (bVar7) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
      }
    }
    std::__basic_future<cs_impl::any>::__basic_future(&local_58,&local_98);
    if (local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_48;
    if (local_58._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (_State_baseV2 *)0x0) {
      std::__throw_future_error(3);
    }
    else {
      fVar3 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>
                        (local_58._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(duration<long,_std::ratio<1L,_1000L>_> *)&local_98);
      if (fVar3 == ready) {
        std::future<cs_impl::any>::get((future<cs_impl::any> *)this);
        if (local_58._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        return (var)(proxy *)this;
      }
    }
    plVar6 = (long *)__cxa_allocate_exception(0x20);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Target function deferred or timeout.","");
    *plVar6 = (long)(plVar6 + 2);
    if (local_78 == &local_68) {
      *(uint *)(plVar6 + 2) = local_68;
      *(undefined4 *)((long)plVar6 + 0x14) = uStack_64;
      *(undefined4 *)(plVar6 + 3) = uStack_60;
      *(undefined4 *)((long)plVar6 + 0x1c) = uStack_5c;
    }
    else {
      *plVar6 = (long)local_78;
      plVar6[2] = CONCAT44(uStack_64,local_68);
    }
    plVar6[1] = local_70;
    local_70 = 0;
    local_68 = local_68 & 0xffffff00;
    local_78 = &local_68;
    __cxa_throw(plVar6,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  std::terminate();
}

Assistant:

cs::var wait_for_impl(std::size_t mill_sec, const cs::callable &func, cs::vector &args)
		{
			std::future<cs::var> future = std::async(std::launch::async, [&func, &args]() -> var {
				return wait_worker(func, args);
			});
			if (future.wait_for(std::chrono::milliseconds(mill_sec)) != std::future_status::ready)
				throw cs::lang_error("Target function deferred or timeout.");
			else
				return future.get();
		}